

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_pray(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  DESCRIPTOR_DATA **ppDVar5;
  char buf [4608];
  
  if (*argument == '\0') {
    pcVar2 = "Pray what?\n\r";
  }
  else {
    if ((ch->comm[0] & 0x400000) == 0) {
      WAIT_STATE(ch,10);
      send_to_char("You pray to the heavens!\n\r",ch);
      __stream = fopen("../logs/prays.txt","a");
      if (__stream != (FILE *)0x0) {
        pcVar2 = log_time();
        sprintf(buf,"%s: %s [%d] is PRAYing for: %s\n",pcVar2,ch->true_name,
                (ulong)(uint)(int)ch->in_room->vnum,argument);
        fputs(buf,__stream);
        fclose(__stream);
      }
      ppDVar5 = &descriptor_list;
      while (ppDVar5 = &((DESCRIPTOR_DATA *)ppDVar5)->next->next,
            (DESCRIPTOR_DATA *)ppDVar5 != (DESCRIPTOR_DATA *)0x0) {
        ch_00 = ((DESCRIPTOR_DATA *)ppDVar5)->original;
        if (ch_00 == (CHAR_DATA *)0x0) {
          ch_00 = ((DESCRIPTOR_DATA *)ppDVar5)->character;
        }
        if ((((((DESCRIPTOR_DATA *)ppDVar5)->connected == 0) &&
             (((DESCRIPTOR_DATA *)ppDVar5)->character != ch)) && ((ch_00->comm[0] & 0x201) == 0)) &&
           (0x33 < ch_00->level)) {
          pcVar3 = get_char_color(ch_00,"prays");
          pcVar2 = ch->true_name;
          sVar1 = ch->in_room->vnum;
          pcVar4 = END_COLOR(ch_00);
          sprintf(buf,"%s%s [%d] is PRAYing for: %s%s\n\r",pcVar3,pcVar2,(ulong)(uint)(int)sVar1,
                  argument,pcVar4);
          send_to_char(buf,((DESCRIPTOR_DATA *)ppDVar5)->character);
        }
      }
      return;
    }
    pcVar2 = "You can\'t pray.\n\r";
  }
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_pray(CHAR_DATA *ch, char *argument)
{
	if (argument[0] == '\0')
	{
		send_to_char("Pray what?\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOCHANNELS))
	{
		send_to_char("You can't pray.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, 10);

	send_to_char("You pray to the heavens!\n\r", ch);

	char buf[MAX_STRING_LENGTH];

	auto fp = fopen(PRAYER_FILE, "a");
	if (fp)
	{
		sprintf(buf, "%s: %s [%d] is PRAYing for: %s\n",
				log_time(),
				ch->true_name,
				ch->in_room->vnum,
				argument);
		fprintf(fp, "%s", buf);
		fclose(fp);
	}

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		auto victim = d->original ? d->original : d->character;

		if (d->connected == CON_PLAYING && d->character != ch && !IS_SET(victim->comm, COMM_SHOUTSOFF) && !IS_SET(victim->comm, COMM_QUIET) && victim->level >= 52)
		{
			sprintf(buf, "%s%s [%d] is PRAYing for: %s%s\n\r",
					get_char_color(victim, "prays"),
					ch->true_name,
					ch->in_room->vnum,
					argument,
					END_COLOR(victim));
			send_to_char(buf, d->character);
		}
	}
}